

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::new_property(XdlEncoder *this,String *name)

{
  String *this_00;
  char *x;
  String *name_local;
  XdlEncoder *this_local;
  
  if ((this->_json & 1U) == 0) {
    this_00 = asl::String::operator<<(&this->_out,name);
    asl::String::operator<<(this_00,'=');
  }
  else {
    new_string(this,name);
    x = ":";
    if ((this->_pretty & 1U) != 0) {
      x = ": ";
    }
    asl::String::operator<<(&this->_out,x);
  }
  return;
}

Assistant:

void XdlEncoder::new_property(const String& name)
{
	if (_json)
	{
		new_string(name);
		_out << (_pretty ? ": " : ":");
	}
	else
		_out << name << '=';
}